

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_std_string_utf.cpp
# Opt level: O2

wstring * ON_UTF_WideChar_to_std_wstring_abi_cxx11_
                    (wstring *__return_storage_ptr__,int bTestByteOrder,wchar_t *sInputUTF,
                    int sInputUTF_count,uint *error_status,uint error_mask,
                    ON__UINT32 error_code_point,int *end_element_index)

{
  wchar_t *sEndElement;
  wstring local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  sEndElement = sInputUTF;
  ON_UTF32_to_std_wstring_abi_cxx11_
            (&local_40,bTestByteOrder,(ON__UINT32 *)sInputUTF,sInputUTF_count,error_status,
             error_mask,error_code_point,(ON__UINT32 **)&sEndElement);
  std::__cxx11::wstring::operator=((wstring *)__return_storage_ptr__,(wstring *)&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  if (end_element_index != (int *)0x0) {
    *end_element_index = (int)((ulong)((long)sEndElement - (long)sInputUTF) >> 2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::wstring ON_UTF_WideChar_to_std_wstring(
  int bTestByteOrder,
  const wchar_t* sInputUTF,
  int sInputUTF_count,
  unsigned int* error_status,
  unsigned int error_mask,
  ON__UINT32 error_code_point,
  int* end_element_index
  ) ON_NOEXCEPT
{
  std::wstring str;
  const wchar_t* sEndElement = sInputUTF;

  switch(sizeof(wchar_t))
  {
  case sizeof(char):
    str = ON_UTF8_to_std_wstring(
      bTestByteOrder,
      (const char*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const char**)&sEndElement
      );
    break;

  case sizeof(ON__UINT16):
    str = ON_UTF16_to_std_wstring(
      bTestByteOrder,
      (const ON__UINT16*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const ON__UINT16**)&sEndElement
      );
    break;

  case sizeof(ON__UINT32):
    str = ON_UTF32_to_std_wstring(
      bTestByteOrder,
      (const ON__UINT32*)sInputUTF,
      sInputUTF_count,
      error_status,
      error_mask,
      error_code_point,
      (const ON__UINT32**)&sEndElement
      );
    break;

  default:
    if ( 0 != error_status )
      *error_status = 1;
    break;
  }

  if ( 0 != end_element_index )
    *end_element_index = static_cast<int>(sEndElement - sInputUTF);

  return str;
}